

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

bool re2::NonASCII(StringPiece *text)

{
  byte bVar1;
  int iVar2;
  int local_1c;
  int i;
  StringPiece *text_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = StringPiece::size(text);
    if (iVar2 <= local_1c) {
      return false;
    }
    bVar1 = StringPiece::operator[](text,local_1c);
    if (0x7f < bVar1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

static bool NonASCII(const StringPiece& text) {
  for (int i = 0; i < text.size(); i++)
    if ((uint8)text[i] >= 0x80)
      return true;
  return false;
}